

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O1

int __thiscall
opengv::point_cloud::OptimizeNonlinearFunctor1::operator()
          (OptimizeNonlinearFunctor1 *this,VectorXd *x,VectorXd *fvec)

{
  double *pdVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  int iVar9;
  PointerType ptr;
  long lVar10;
  Indices *pIVar11;
  int iVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  transformation_t transformation;
  cayley_t cayley;
  double local_180 [10];
  double adStack_130 [6];
  undefined8 uStack_100;
  double local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  double local_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double local_c0;
  double dStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  double local_80;
  double dStack_78;
  cayley_t local_70 [2];
  
  pdVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  local_d8 = *pdVar1;
  dStack_d0 = pdVar1[1];
  local_c8 = pdVar1[2];
  local_70[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = pdVar1[3];
  local_70[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = pdVar1[4];
  local_70[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = pdVar1[5];
  math::cayley2rot(local_70);
  lVar10 = 0x10;
  do {
    uVar2 = *(undefined8 *)((long)local_180 + lVar10 + 8);
    *(undefined8 *)((long)adStack_130 + lVar10) = *(undefined8 *)((long)local_180 + lVar10);
    *(undefined8 *)((long)adStack_130 + lVar10 + 8) = uVar2;
    *(undefined8 *)((long)adStack_130 + lVar10 + 0x10) =
         *(undefined8 *)((long)local_180 + lVar10 + 0x10);
    dVar8 = local_c8;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x58);
  pIVar11 = this->_indices;
  if (pIVar11->_numberCorrespondences != 0) {
    local_90 = adStack_130[2];
    uStack_88 = adStack_130[3];
    local_a0 = adStack_130[5];
    uStack_98 = uStack_100;
    local_b0 = local_f0;
    uStack_a8 = uStack_e8;
    local_c0 = local_d8;
    dStack_b8 = dStack_d0;
    local_180[0] = adStack_130[4];
    lVar10 = 0;
    uVar13 = 0;
    do {
      iVar12 = (int)uVar13;
      iVar9 = iVar12;
      if (pIVar11->_useIndices != false) {
        iVar9 = *(int *)((long)(pIVar11->_indices->super__Vector_base<int,_std::allocator<int>_>).
                               _M_impl.super__Vector_impl_data._M_start + (lVar10 >> 0x1e));
      }
      (*this->_adapter->_vptr_PointCloudAdapterBase[3])(local_180 + 2,this->_adapter,(long)iVar9);
      auVar6._8_8_ = uStack_88;
      auVar6._0_8_ = local_90;
      auVar14._8_8_ = local_180[2];
      auVar14._0_8_ = local_180[2];
      auVar14 = vmulpd_avx512vl(auVar6,auVar14);
      if (this->_indices->_useIndices != false) {
        iVar12 = *(int *)((long)(this->_indices->_indices->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start + (lVar10 >> 0x1e));
      }
      auVar16._8_8_ = local_180[3];
      auVar16._0_8_ = local_180[3];
      auVar17._8_8_ = local_180[4];
      auVar17._0_8_ = local_180[4];
      auVar5._8_8_ = uStack_98;
      auVar5._0_8_ = local_a0;
      auVar14 = vfmadd231pd_fma(auVar14,auVar16,auVar5);
      auVar4._8_8_ = uStack_a8;
      auVar4._0_8_ = local_b0;
      auVar14 = vfmadd231pd_fma(auVar14,auVar17,auVar4);
      local_80 = auVar14._0_8_ + local_c0;
      dStack_78 = auVar14._8_8_ + dStack_b8;
      local_180[1] = local_180[0] * local_180[2] + local_180[3] * local_f8 +
                     local_180[4] * local_e0 + dVar8;
      (*this->_adapter->_vptr_PointCloudAdapterBase[2])(local_180 + 2,this->_adapter,(long)iVar12);
      auVar3._8_8_ = local_180[3];
      auVar3._0_8_ = local_180[2];
      auVar7._8_8_ = dStack_78;
      auVar7._0_8_ = local_80;
      auVar14 = vsubpd_avx(auVar3,auVar7);
      auVar15._8_8_ = 0;
      auVar15._0_8_ =
           (local_180[4] - local_180[1]) * (local_180[4] - local_180[1]) +
           auVar14._0_8_ * auVar14._0_8_ + auVar14._8_8_ * auVar14._8_8_;
      auVar14 = vsqrtsd_avx(auVar15,auVar15);
      (fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [uVar13] = auVar14._0_8_;
      uVar13 = uVar13 + 1;
      pIVar11 = this->_indices;
      lVar10 = lVar10 + 0x100000000;
    } while (uVar13 < pIVar11->_numberCorrespondences);
  }
  return 0;
}

Assistant:

int operator()(const VectorXd &x, VectorXd &fvec) const
  {
    assert( x.size() == 6 );
    assert( (unsigned int) fvec.size() == _indices.size());

    //compute the current position
    transformation_t transformation;
    transformation.col(3) = x.block<3,1>(0,0);
    cayley_t cayley = x.block<3,1>(3,0);
    transformation.block<3,3>(0,0) = math::cayley2rot(cayley);

    Eigen::Matrix<double,4,1> p_hom;
    p_hom[3] = 1.0;

    for( size_t i = 0; i < _indices.size(); i++ )
    {
      p_hom.block<3,1>(0,0) = _adapter.getPoint2(_indices[i]);
      point_t transformedPoint = transformation * p_hom;
      translation_t error = _adapter.getPoint1(_indices[i]) - transformedPoint;
      fvec[i] = error.norm();
    }

    return 0;
  }